

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.hpp
# Opt level: O0

void __thiscall MC::MC_Driver::oppop(MC_Driver *this,int op)

{
  int *this_00;
  reference pvVar1;
  undefined1 local_a0 [8];
  condition cl;
  string c;
  int op_local;
  MC_Driver *this_local;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->condStack).colunm,(long)((this->condStack).top + -1));
  this_00 = &cl.key.intV;
  std::__cxx11::string::string((string *)this_00,(string *)pvVar1);
  condition::condition((condition *)local_a0);
  std::__cxx11::string::operator=((string *)&cl,(string *)this_00);
  cl._36_4_ = (this->condStack).stackTopType;
  cl.op = (this->condStack).stackTopType;
  cl._40_4_ = op;
  if ((this->condStack).stackTopType == 50000) {
    cl.key._32_4_ = (this->condStack).tempInt;
    std::vector<condition,_std::allocator<condition>_>::push_back
              (this->stmt->c_list,(value_type *)local_a0);
  }
  else if ((this->condStack).stackTopType == 90000) {
    cl.key._36_4_ = (this->condStack).tempFloat;
    std::vector<condition,_std::allocator<condition>_>::push_back
              (this->stmt->c_list,(value_type *)local_a0);
  }
  else {
    std::__cxx11::string::operator=((string *)&cl.key,(string *)&(this->condStack).tempString);
    std::vector<condition,_std::allocator<condition>_>::push_back
              (this->stmt->c_list,(value_type *)local_a0);
  }
  condition::~condition((condition *)local_a0);
  std::__cxx11::string::~string((string *)&cl.key.intV);
  return;
}

Assistant:

void oppop(int op){
        std::string c = condStack.colunm[condStack.top-1];
        struct condition cl;
        cl.colunmName = c;
        cl.op = op;
        cl.type = condStack.stackTopType;
        cl.key.type = condStack.stackTopType;
        if(condStack.stackTopType == 50000){
            //int
            cl.key.intV = condStack.tempInt;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.intV<<std::endl;
        }else if(condStack.stackTopType == 90000){
            //float
            cl.key.floatV = condStack.tempFloat;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.floatV<<std::endl;
        }else{
            //string
            cl.key.charV = condStack.tempString;
            stmt->c_list->push_back(cl);
            //std::cout<<cl.key.type<<" "<<cl.key.charV<<std::endl;
        }
        
    }